

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexImage2DParamsCase::createTexture(TexImage2DParamsCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  int i_1;
  int iVar1;
  int iVar2;
  TransferFormat TVar3;
  int i;
  long lVar4;
  uint rowPitch;
  deUint32 tex;
  Vec4 colorB;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 cScale;
  Vector<float,_4> res;
  Vec4 colorA;
  Vec4 cBias;
  float local_40 [4];
  
  this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
  TVar3 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar1 = tcu::TextureFormat::getPixelSize(this_01);
  iVar2 = this->m_rowLength;
  if (iVar2 < 1) {
    iVar2 = (this->super_Texture2DSpecCase).m_width;
  }
  rowPitch = -this->m_alignment & (iVar2 * iVar1 + this->m_alignment) - 1U;
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((this->m_skipRows + (this->super_Texture2DSpecCase).m_height) *
                               rowPitch + this->m_skipPixels * iVar1));
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    cScale.m_data[lVar4] =
         (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar4] -
         (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  cBias.m_data._0_8_ =
       *(undefined8 *)(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data;
  cBias.m_data._8_8_ =
       *(undefined8 *)((this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data + 2);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    res.m_data[lVar4] = colorB.m_data[lVar4] * cScale.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  colorA.m_data[0] = 0.0;
  colorA.m_data[1] = 0.0;
  colorA.m_data[2] = 0.0;
  colorA.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    colorA.m_data[lVar4] = res.m_data[lVar4] + cBias.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_40[0] = 0.0;
  local_40[1] = 1.0;
  local_40[2] = 0.0;
  local_40[3] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    res.m_data[lVar4] = local_40[lVar4] * cScale.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  colorB.m_data[0] = 0.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    colorB.m_data[lVar4] = res.m_data[lVar4] + cBias.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res,this_01,(this->super_Texture2DSpecCase).m_width,
             (this->super_Texture2DSpecCase).m_height,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)(iVar1 * this->m_skipPixels) + (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid((PixelBufferAccess *)&res,4,&colorA,&colorB);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             TVar3.format,TVar3.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(pixelSize * m_skipPixels + rowPitch * (m_height + m_skipRows));
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);
	}